

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddRow(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *row,bool scale)

{
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  uint *puVar1;
  int iVar2;
  int iVar3;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  pointer pnVar5;
  pointer pnVar6;
  Item *pIVar7;
  type_conflict5 tVar8;
  double *pdVar9;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar10;
  undefined7 in_register_00000011;
  ulong uVar11;
  int iVar12;
  uint local_2f8;
  int idx;
  Item *local_2e8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d8;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  int local_248;
  undefined1 local_244;
  undefined8 local_240;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  empty;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  int local_e8;
  undefined1 local_e4;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  undefined1 local_94;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  undefined1 local_44;
  undefined8 local_40;
  
  iVar2 = (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar3 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  idx = iVar2;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add(&this->
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ,row);
  local_2e8 = (this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[iVar2].idx;
  local_2f8 = 0;
  if (((int)CONCAT71(in_register_00000011,scale) != 0) &&
     (pSVar4 = this->lp_scaler,
     pSVar4 != (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0)) {
    local_2f8 = (*pSVar4->_vptr_SPxScaler[1])
                          (pSVar4,local_2e8,
                           &(this->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).scaleExp);
    pnVar5 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar9 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<100U,_int,_void> *)&empty,*pdVar9,(type *)0x0);
    tVar8 = boost::multiprecision::operator<(pnVar5 + iVar2,&empty.up);
    if (tVar8) {
      pnVar5 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_88 = *(undefined8 *)&pnVar5[iVar2].m_backend.data;
      uStack_80 = *(undefined8 *)(pnVar5[iVar2].m_backend.data._M_elems + 2);
      puVar1 = pnVar5[iVar2].m_backend.data._M_elems + 4;
      local_78 = *(undefined8 *)puVar1;
      uStack_70 = *(undefined8 *)(puVar1 + 2);
      puVar1 = pnVar5[iVar2].m_backend.data._M_elems + 8;
      local_68 = *(undefined8 *)puVar1;
      uStack_60 = *(undefined8 *)(puVar1 + 2);
      puVar1 = pnVar5[iVar2].m_backend.data._M_elems + 0xc;
      local_58 = *(undefined8 *)puVar1;
      uStack_50 = *(undefined8 *)(puVar1 + 2);
      local_48 = pnVar5[iVar2].m_backend.exp;
      local_44 = pnVar5[iVar2].m_backend.neg;
      local_40._0_4_ = pnVar5[iVar2].m_backend.fpclass;
      local_40._4_4_ = pnVar5[iVar2].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&empty,(soplex *)&local_88,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)local_2f8,CONCAT31((int3)((uint)local_48 >> 8),local_44));
      pnVar6 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = pnVar6[iVar2].m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar1 = empty.up.m_backend.data._M_elems._48_8_;
      *(undefined8 *)(puVar1 + 2) = empty.up.m_backend.data._M_elems._56_8_;
      puVar1 = pnVar6[iVar2].m_backend.data._M_elems + 8;
      *(undefined8 *)puVar1 = empty.up.m_backend.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = empty.up.m_backend.data._M_elems._40_8_;
      puVar1 = pnVar6[iVar2].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = empty.up.m_backend.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = empty.up.m_backend.data._M_elems._24_8_;
      pnVar5 = pnVar6 + iVar2;
      (pnVar5->m_backend).data._M_elems[0] = empty.up.m_backend.data._M_elems[0];
      (pnVar5->m_backend).data._M_elems[1] = empty.up.m_backend.data._M_elems[1];
      (pnVar5->m_backend).data._M_elems[2] = empty.up.m_backend.data._M_elems[2];
      (pnVar5->m_backend).data._M_elems[3] = empty.up.m_backend.data._M_elems[3];
      pnVar6[iVar2].m_backend.exp = empty.up.m_backend.exp;
      pnVar6[iVar2].m_backend.neg = empty.up.m_backend.neg;
      pnVar6[iVar2].m_backend.fpclass = empty.up.m_backend.fpclass;
      pnVar6[iVar2].m_backend.prec_elem = empty.up.m_backend.prec_elem;
    }
    pnVar5 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).left.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar9 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<100U,_int,_void> *)&empty,-*pdVar9,(type *)0x0);
    tVar8 = boost::multiprecision::operator>(pnVar5 + iVar2,&empty.up);
    if (tVar8) {
      pnVar5 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_d8 = *(undefined8 *)&pnVar5[iVar2].m_backend.data;
      uStack_d0 = *(undefined8 *)(pnVar5[iVar2].m_backend.data._M_elems + 2);
      puVar1 = pnVar5[iVar2].m_backend.data._M_elems + 4;
      local_c8 = *(undefined8 *)puVar1;
      uStack_c0 = *(undefined8 *)(puVar1 + 2);
      puVar1 = pnVar5[iVar2].m_backend.data._M_elems + 8;
      local_b8 = *(undefined8 *)puVar1;
      uStack_b0 = *(undefined8 *)(puVar1 + 2);
      puVar1 = pnVar5[iVar2].m_backend.data._M_elems + 0xc;
      local_a8 = *(undefined8 *)puVar1;
      uStack_a0 = *(undefined8 *)(puVar1 + 2);
      local_98 = pnVar5[iVar2].m_backend.exp;
      local_94 = pnVar5[iVar2].m_backend.neg;
      local_90._0_4_ = pnVar5[iVar2].m_backend.fpclass;
      local_90._4_4_ = pnVar5[iVar2].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&empty,(soplex *)&local_d8,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)local_2f8,CONCAT31((int3)((uint)local_98 >> 8),local_94));
      pnVar5 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = pnVar5[iVar2].m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar1 = empty.up.m_backend.data._M_elems._48_8_;
      *(undefined8 *)(puVar1 + 2) = empty.up.m_backend.data._M_elems._56_8_;
      puVar1 = pnVar5[iVar2].m_backend.data._M_elems + 8;
      *(undefined8 *)puVar1 = empty.up.m_backend.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = empty.up.m_backend.data._M_elems._40_8_;
      puVar1 = pnVar5[iVar2].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = empty.up.m_backend.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = empty.up.m_backend.data._M_elems._24_8_;
      *(ulong *)&pnVar5[iVar2].m_backend.data =
           CONCAT44(empty.up.m_backend.data._M_elems[1],empty.up.m_backend.data._M_elems[0]);
      *(ulong *)(pnVar5[iVar2].m_backend.data._M_elems + 2) =
           CONCAT44(empty.up.m_backend.data._M_elems[3],empty.up.m_backend.data._M_elems[2]);
      pnVar5[iVar2].m_backend.exp = empty.up.m_backend.exp;
      pnVar5[iVar2].m_backend.neg = empty.up.m_backend.neg;
      pnVar5[iVar2].m_backend.fpclass = empty.up.m_backend.fpclass;
      pnVar5[iVar2].m_backend.prec_elem = empty.up.m_backend.prec_elem;
    }
    pnVar5 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_128 = *(undefined8 *)&pnVar5[iVar2].m_backend.data;
    uStack_120 = *(undefined8 *)(pnVar5[iVar2].m_backend.data._M_elems + 2);
    puVar1 = pnVar5[iVar2].m_backend.data._M_elems + 4;
    local_118 = *(undefined8 *)puVar1;
    uStack_110 = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar5[iVar2].m_backend.data._M_elems + 8;
    local_108 = *(undefined8 *)puVar1;
    uStack_100 = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar5[iVar2].m_backend.data._M_elems + 0xc;
    local_f8 = *(undefined8 *)puVar1;
    uStack_f0 = *(undefined8 *)(puVar1 + 2);
    local_e8 = pnVar5[iVar2].m_backend.exp;
    local_e4 = pnVar5[iVar2].m_backend.neg;
    local_e0._0_4_ = pnVar5[iVar2].m_backend.fpclass;
    local_e0._4_4_ = pnVar5[iVar2].m_backend.prec_elem;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)&empty,(soplex *)&local_128,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)local_2f8,CONCAT31((int3)((uint)local_e8 >> 8),local_e4));
    pnVar5 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = pnVar5[iVar2].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar1 = empty.up.m_backend.data._M_elems._48_8_;
    *(undefined8 *)(puVar1 + 2) = empty.up.m_backend.data._M_elems._56_8_;
    puVar1 = pnVar5[iVar2].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar1 = empty.up.m_backend.data._M_elems._32_8_;
    *(undefined8 *)(puVar1 + 2) = empty.up.m_backend.data._M_elems._40_8_;
    puVar1 = pnVar5[iVar2].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar1 = empty.up.m_backend.data._M_elems._16_8_;
    *(undefined8 *)(puVar1 + 2) = empty.up.m_backend.data._M_elems._24_8_;
    *(ulong *)&pnVar5[iVar2].m_backend.data =
         CONCAT44(empty.up.m_backend.data._M_elems[1],empty.up.m_backend.data._M_elems[0]);
    *(ulong *)(pnVar5[iVar2].m_backend.data._M_elems + 2) =
         CONCAT44(empty.up.m_backend.data._M_elems[3],empty.up.m_backend.data._M_elems[2]);
    pnVar5[iVar2].m_backend.exp = empty.up.m_backend.exp;
    pnVar5[iVar2].m_backend.neg = empty.up.m_backend.neg;
    pnVar5[iVar2].m_backend.fpclass = empty.up.m_backend.fpclass;
    pnVar5[iVar2].m_backend.prec_elem = empty.up.m_backend.prec_elem;
    (this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).scaleExp.data[iVar2] = local_2f8;
  }
  this_00 = &this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  uVar11 = (ulong)(uint)(local_2e8->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused;
  local_2e0 = this;
  while (pIVar7 = local_2e8, 0 < (int)uVar11) {
    uVar11 = uVar11 - 1;
    pNVar10 = (local_2e8->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    iVar2 = pNVar10[uVar11].idx;
    if (scale) {
      local_288 = *(undefined8 *)&pNVar10[uVar11].val.m_backend.data;
      uStack_280 = *(undefined8 *)(pNVar10[uVar11].val.m_backend.data._M_elems + 2);
      puVar1 = pNVar10[uVar11].val.m_backend.data._M_elems + 4;
      local_278 = *(undefined8 *)puVar1;
      uStack_270 = *(undefined8 *)(puVar1 + 2);
      puVar1 = pNVar10[uVar11].val.m_backend.data._M_elems + 8;
      local_268 = *(undefined8 *)puVar1;
      uStack_260 = *(undefined8 *)(puVar1 + 2);
      puVar1 = pNVar10[uVar11].val.m_backend.data._M_elems + 0xc;
      local_258 = *(undefined8 *)puVar1;
      uStack_250 = *(undefined8 *)(puVar1 + 2);
      local_248 = pNVar10[uVar11].val.m_backend.exp;
      local_244 = pNVar10[uVar11].val.m_backend.neg;
      local_240._0_4_ = pNVar10[uVar11].val.m_backend.fpclass;
      local_240._4_4_ = pNVar10[uVar11].val.m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&empty,(soplex *)&local_288,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)((this->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).scaleExp.data[iVar2] + local_2f8),
                 CONCAT31((int3)((uint)local_248 >> 8),local_244));
      pNVar10 = (pIVar7->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      puVar1 = pNVar10[uVar11].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar1 = empty.up.m_backend.data._M_elems._48_8_;
      *(undefined8 *)(puVar1 + 2) = empty.up.m_backend.data._M_elems._56_8_;
      puVar1 = pNVar10[uVar11].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar1 = empty.up.m_backend.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = empty.up.m_backend.data._M_elems._40_8_;
      puVar1 = pNVar10[uVar11].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = empty.up.m_backend.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = empty.up.m_backend.data._M_elems._24_8_;
      *(ulong *)&pNVar10[uVar11].val.m_backend.data =
           CONCAT44(empty.up.m_backend.data._M_elems[1],empty.up.m_backend.data._M_elems[0]);
      *(ulong *)(pNVar10[uVar11].val.m_backend.data._M_elems + 2) =
           CONCAT44(empty.up.m_backend.data._M_elems[3],empty.up.m_backend.data._M_elems[2]);
      pNVar10[uVar11].val.m_backend.exp = empty.up.m_backend.exp;
      pNVar10[uVar11].val.m_backend.neg = empty.up.m_backend.neg;
      pNVar10[uVar11].val.m_backend.fpclass = empty.up.m_backend.fpclass;
      pNVar10[uVar11].val.m_backend.prec_elem = empty.up.m_backend.prec_elem;
      pNVar10 = (pIVar7->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      this = local_2e0;
    }
    local_2d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pNVar10[uVar11].val.m_backend.data;
    local_2d8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pNVar10[uVar11].val.m_backend.data._M_elems + 2);
    puVar1 = pNVar10[uVar11].val.m_backend.data._M_elems + 4;
    local_2d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_2d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = pNVar10[uVar11].val.m_backend.data._M_elems + 8;
    local_2d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_2d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = pNVar10[uVar11].val.m_backend.data._M_elems + 0xc;
    local_2d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_2d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_2d8.m_backend.exp = pNVar10[uVar11].val.m_backend.exp;
    local_2d8.m_backend.neg = pNVar10[uVar11].val.m_backend.neg;
    local_2d8.m_backend.fpclass = pNVar10[uVar11].val.m_backend.fpclass;
    local_2d8.m_backend.prec_elem = pNVar10[uVar11].val.m_backend.prec_elem;
    if ((this->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum <= iVar2) {
      LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::LPColBase(&empty,0);
      for (iVar12 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum; iVar12 <= iVar2; iVar12 = iVar12 + 1) {
        LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(this_00,&empty);
      }
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~DSVectorBase(&empty.vec);
    }
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add2(this_00,iVar2,1,&idx,&local_2d8);
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])(this,1);
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x51])
            (this,(ulong)(uint)((this->
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum - iVar3));
  return;
}

Assistant:

void doAddRow(const LPRowBase<R>& row, bool scale = false)
   {
      int idx = nRows();
      int oldColNumber = nCols();
      int newRowScaleExp = 0;

      LPRowSetBase<R>::add(row);

      SVectorBase<R>& vec = rowVector_w(idx);

      DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

      // compute new row scaling factor and apply it to the sides
      if(scale && lp_scaler)
      {
         newRowScaleExp = lp_scaler->computeScaleExp(vec, colscaleExp);

         if(rhs(idx) < R(infinity))
            rhs_w(idx) = spxLdexp(rhs_w(idx), newRowScaleExp);

         if(lhs(idx) > R(-infinity))
            lhs_w(idx) = spxLdexp(lhs_w(idx), newRowScaleExp);

         maxRowObj_w(idx) = spxLdexp(maxRowObj_w(idx), newRowScaleExp);

         LPRowSetBase<R>::scaleExp[idx] = newRowScaleExp;
      }

      // now insert nonzeros to column file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new row and existing column scaling factors to new values in RowSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[i]);

         R val = vec.value(j);

         // create new columns if required
         if(i >= nCols())
         {
            LPColBase<R> empty;

            for(int k = nCols(); k <= i; ++k)
               LPColSetBase<R>::add(empty);
         }

         assert(i < nCols());
         LPColSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedRows(1);
      addedCols(nCols() - oldColNumber);
   }